

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits_avx512_uint16
                 (uint64_t *array,size_t length,uint16_t *vout,size_t capacity,uint16_t base)

{
  int iVar1;
  undefined1 (*pauVar2) [64];
  long in_RCX;
  undefined1 (*in_RDX) [64];
  ulong in_RSI;
  long in_RDI;
  ushort in_R8W;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  uint32_t val;
  int r;
  uint64_t t;
  uint64_t w;
  __m512i r2;
  __m512i r1;
  __m512i vbase;
  uint8_t advance;
  __m512i vec;
  uint64_t v;
  size_t i;
  __m512i index_table;
  __m512i base_v;
  uint16_t *safeout;
  uint16_t *initout;
  uint16_t *out;
  short local_c98;
  ulong local_c88;
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [64];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  byte local_901;
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  uint64_t local_850;
  ulong local_848;
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 (*local_7c0) [64];
  undefined1 (*local_7b8) [64];
  undefined1 (*local_7b0) [64];
  ushort local_7a2;
  ulong local_790;
  long local_788;
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 (*local_6c8) [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 (*local_610) [64];
  uint8_t *local_608;
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  uint64_t local_548;
  undefined1 local_540 [64];
  ushort local_4c2;
  undefined1 local_4c0 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [64];
  
  local_7c0 = (undefined1 (*) [64])(*in_RDX + in_RCX * 2);
  auVar3 = vpbroadcastw_avx512bw(ZEXT216(in_R8W));
  local_4c0 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(local_4c0);
  local_800 = vmovdqa64_avx512f(auVar3);
  local_608 = "";
  auVar3 = vmovdqu64_avx512f((undefined1  [64])vbmi2_table);
  local_840 = vmovdqa64_avx512f(auVar3);
  local_7b8 = in_RDX;
  local_7b0 = in_RDX;
  local_7a2 = in_R8W;
  local_790 = in_RSI;
  local_788 = in_RDI;
  for (local_848 = 0; local_848 < local_790 && local_7b0 + 2 < local_7c0; local_848 = local_848 + 1)
  {
    local_850 = *(uint64_t *)(local_788 + local_848 * 8);
    auVar3 = vmovdqa64_avx512f(local_840);
    local_900 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_900);
    local_600 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_600);
    local_5c0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_5c0);
    local_c0 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
    vmovdqa64_avx512f(local_c0);
    auVar3 = vpcompressb_avx512_vbmi2(auVar3,local_850);
    local_8c0 = vmovdqa64_avx512f(auVar3);
    local_548 = local_850;
    iVar1 = roaring_hamming(local_850);
    local_901 = (byte)iVar1;
    auVar3 = vmovdqa64_avx512f(local_800);
    local_4c2 = (ushort)((int)local_848 << 6);
    auVar4 = vpbroadcastw_avx512bw(ZEXT216(local_4c2));
    local_540 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_540);
    local_9c0 = vmovdqa64_avx512f(auVar3);
    local_a00 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_a00);
    local_200 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_9c0);
    local_240 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_240);
    auVar4 = vmovdqa64_avx512f(local_200);
    local_180 = vmovdqa64_avx512f(auVar3);
    local_1c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_180);
    auVar4 = vmovdqa64_avx512f(local_1c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_980 = vmovdqa64_avx512f(auVar3);
    local_a60 = local_8c0._0_8_;
    uStack_a58 = local_8c0._8_8_;
    uStack_a50 = local_8c0._16_8_;
    uStack_a48 = local_8c0._24_8_;
    local_100 = local_8c0._0_8_;
    uStack_f8 = local_8c0._8_8_;
    uStack_f0 = local_8c0._16_8_;
    uStack_e8 = local_8c0._24_8_;
    local_e0 = local_8c0._0_8_;
    uStack_d8 = local_8c0._8_8_;
    uStack_d0 = local_8c0._16_8_;
    uStack_c8 = local_8c0._24_8_;
    auVar3 = vpmovsxbw_avx512bw(local_8c0._0_32_);
    local_a40 = vmovdqa64_avx512f(auVar3);
    local_ae0 = local_8c0._32_8_;
    uStack_ad8 = local_8c0._40_8_;
    uStack_ad0 = local_8c0._48_8_;
    uStack_ac8 = local_8c0._56_8_;
    local_140 = local_8c0._32_8_;
    uStack_138 = local_8c0._40_8_;
    uStack_130 = local_8c0._48_8_;
    uStack_128 = local_8c0._56_8_;
    local_120 = local_8c0._32_8_;
    uStack_118 = local_8c0._40_8_;
    uStack_110 = local_8c0._48_8_;
    uStack_108 = local_8c0._56_8_;
    auVar3 = vpmovsxbw_avx512bw(local_8c0._32_32_);
    local_ac0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_a40);
    auVar4 = vmovdqa64_avx512f(local_980);
    local_b40 = vmovdqa64_avx512f(auVar3);
    local_b80 = vmovdqa64_avx512f(auVar4);
    memcpy(local_300,local_b80,0x40);
    memcpy(local_340,local_b40,0x40);
    auVar3 = vmovdqa64_avx512f(local_340);
    auVar4 = vmovdqa64_avx512f(local_300);
    local_280 = vmovdqa64_avx512f(auVar3);
    local_2c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_280);
    auVar4 = vmovdqa64_avx512f(local_2c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_a40 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_ac0);
    auVar4 = vmovdqa64_avx512f(local_980);
    local_bc0 = vmovdqa64_avx512f(auVar3);
    local_c00 = vmovdqa64_avx512f(auVar4);
    memcpy(local_400,local_c00,0x40);
    memcpy(local_440,local_bc0,0x40);
    pauVar2 = local_7b0;
    auVar3 = vmovdqa64_avx512f(local_440);
    auVar4 = vmovdqa64_avx512f(local_400);
    local_380 = vmovdqa64_avx512f(auVar3);
    local_3c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_380);
    auVar4 = vmovdqa64_avx512f(local_3c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_ac0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_a40);
    local_c40 = vmovdqa64_avx512f(auVar3);
    memcpy(local_6c0,local_c40,0x40);
    auVar3 = vmovdqa64_avx512f(local_6c0);
    local_610 = pauVar2;
    local_680 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_680);
    auVar3 = vmovdqu64_avx512f(auVar3);
    *pauVar2 = auVar3;
    pauVar2 = local_7b0 + 1;
    auVar3 = vmovdqa64_avx512f(local_ac0);
    local_c80 = vmovdqa64_avx512f(auVar3);
    memcpy(local_780,local_c80,0x40);
    auVar3 = vmovdqa64_avx512f(local_780);
    local_740 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_740);
    auVar3 = vmovdqu64_avx512f(auVar3);
    *pauVar2 = auVar3;
    local_7b0 = (undefined1 (*) [64])(*local_7b0 + (long)(int)(uint)local_901 * 2);
    local_6c8 = pauVar2;
  }
  local_7a2 = local_7a2 + (short)local_848 * 0x40;
  for (; local_848 < local_790 && local_7b0 < local_7c0; local_848 = local_848 + 1) {
    for (local_c88 = *(ulong *)(local_788 + local_848 * 8); local_c88 != 0 && local_7b0 < local_7c0;
        local_c88 = local_c88 & (local_c88 ^ 0xffffffffffffffff) + 1 ^ local_c88) {
      iVar1 = roaring_trailing_zeroes(local_c88);
      local_c98 = (short)iVar1 + local_7a2;
      *(short *)*local_7b0 = local_c98;
      local_7b0 = (undefined1 (*) [64])(*local_7b0 + 2);
    }
    local_7a2 = local_7a2 + 0x40;
  }
  return (long)local_7b0 - (long)local_7b8 >> 1;
}

Assistant:

size_t bitset_extract_setbits_avx512_uint16(const uint64_t *array,
                                            size_t length, uint16_t *vout,
                                            size_t capacity, uint16_t base) {
    uint16_t *out = (uint16_t *)vout;
    uint16_t *initout = out;
    uint16_t *safeout = vout + capacity;

    __m512i base_v = _mm512_set1_epi16(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i++) {
        uint64_t v = array[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi16(base_v, _mm512_set1_epi16((short)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 1));

        r1 = _mm512_add_epi16(r1, vbase);
        r2 = _mm512_add_epi16(r2, vbase);

        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 32), r2);
        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = array[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t =
                w & (~w + 1);  // on x64, should compile to BLSI (careful: the
                               // Intel compiler seems to fail)
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val, sizeof(uint16_t));
            out++;
            w ^= t;
        }
        base += 64;
    }

    return out - initout;
}